

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

base_learner * CSOAA::csoaa_setup(options_i *options,vw *all)

{
  int iVar1;
  polyprediction *ppVar2;
  base_learner *l;
  single_learner *base;
  learner<CSOAA::csoaa,_example> *plVar3;
  long lVar4;
  undefined **ppuVar5;
  label_parser *plVar6;
  byte bVar7;
  allocator local_162;
  allocator local_161;
  free_ptr<CSOAA::csoaa> c;
  string local_150 [32];
  string local_130;
  string local_110;
  option_group_definition new_options;
  undefined1 local_b8 [112];
  bool local_48;
  
  bVar7 = 0;
  scoped_calloc_or_throw<CSOAA::csoaa>();
  std::__cxx11::string::string
            ((string *)&local_110,"Cost Sensitive One Against All",(allocator *)local_b8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"csoaa",&local_161);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_b8,&local_130,
             &(c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl)->num_classes);
  local_48 = true;
  std::__cxx11::string::string(local_150,"One-against-all multiclass with <k> costs",&local_162);
  std::__cxx11::string::_M_assign((string *)(local_b8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&new_options,(typed_option<unsigned_int> *)local_b8);
  std::__cxx11::string::~string(local_150);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_b8);
  std::__cxx11::string::~string((string *)&local_130);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_b8,"csoaa",(allocator *)local_150);
  iVar1 = (*options->_vptr_options_i[1])(options,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  if ((char)iVar1 == '\0') {
    plVar3 = (learner<CSOAA::csoaa,_example> *)0x0;
  }
  else {
    ppVar2 = calloc_or_throw<polyprediction>
                       ((ulong)(c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl)->
                               num_classes);
    (c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl)->pred = ppVar2;
    l = setup_base(all->options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar3 = LEARNER::learner<CSOAA::csoaa,example>::init_learner<LEARNER::learner<char,example>>
                       (c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl,base,
                        predict_or_learn<true>,predict_or_learn<false>,
                        (ulong)(c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl)->
                               num_classes,multiclass);
    c._M_t.super___uniq_ptr_impl<CSOAA::csoaa,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CSOAA::csoaa_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CSOAA::csoaa_*,_false>._M_head_impl = (csoaa *)0x0;
    ppuVar5 = &COST_SENSITIVE::cs_label;
    plVar6 = &all->p->lp;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      plVar6->default_label = (_func_void_void_ptr *)*ppuVar5;
      ppuVar5 = ppuVar5 + (ulong)bVar7 * -2 + 1;
      plVar6 = (label_parser *)((long)plVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    all->label_type = cs;
    *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
    *(code **)(plVar3 + 0x68) = finish_example;
    *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
    *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
    *(code **)(plVar3 + 200) = finish;
    all->cost_sensitive = (base_learner *)plVar3;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::~unique_ptr(&c);
  return (base_learner *)plVar3;
}

Assistant:

base_learner* csoaa_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<csoaa>();
  option_group_definition new_options("Cost Sensitive One Against All");
  new_options.add(make_option("csoaa", c->num_classes).keep().help("One-against-all multiclass with <k> costs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("csoaa"))
    return nullptr;

  c->pred = calloc_or_throw<polyprediction>(c->num_classes);

  learner<csoaa, example>& l = init_learner(c, as_singleline(setup_base(*all.options, all)), predict_or_learn<true>,
      predict_or_learn<false>, c->num_classes, prediction_type::multiclass);
  all.p->lp = cs_label;
  all.label_type = label_type::cs;

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}